

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Type> *
wasm::WATParser::tabletypeContinued<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,Type addressType)

{
  undefined8 uVar1;
  ParseModuleTypesCtx *pPVar2;
  bool bVar3;
  Type *pTVar4;
  Type local_138;
  Err local_130;
  Err *local_110;
  Err *err_1;
  Result<wasm::Type> _val_1;
  Result<wasm::Type> type;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  Result<wasm::Ok> _val;
  undefined1 local_48 [8];
  Result<wasm::Ok> limits;
  ParseModuleTypesCtx *ctx_local;
  Type addressType_local;
  
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_4_ = 2;
  limits.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = ctx;
  ctx_local = (ParseModuleTypesCtx *)addressType.id;
  addressType_local.id = (uintptr_t)__return_storage_ptr__;
  bVar3 = wasm::Type::operator==
                    ((Type *)&ctx_local,
                     (BasicType *)
                     ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x24));
  if (bVar3) {
    limits32<wasm::WATParser::ParseModuleTypesCtx>
              ((Result<wasm::Ok> *)local_48,
               (ParseModuleTypesCtx *)
               limits.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
  }
  else {
    limits64<wasm::WATParser::ParseModuleTypesCtx>
              ((Result<wasm::Ok> *)local_48,
               (ParseModuleTypesCtx *)
               limits.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
  }
  Result<wasm::Ok>::Result((Result<wasm::Ok> *)local_78,(Result<wasm::Ok> *)local_48);
  local_90 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_78);
  bVar3 = local_90 == (Err *)0x0;
  if (!bVar3) {
    wasm::Err::Err(&local_b0,local_90);
    Result<wasm::Type>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_78);
  if (bVar3) {
    reftype<wasm::WATParser::ParseModuleTypesCtx>
              ((Result<wasm::Type> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
               (ParseModuleTypesCtx *)
               limits.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
    Result<wasm::Type>::Result
              ((Result<wasm::Type> *)&err_1,
               (Result<wasm::Type> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    local_110 = Result<wasm::Type>::getErr((Result<wasm::Type> *)&err_1);
    bVar3 = local_110 == (Err *)0x0;
    if (!bVar3) {
      wasm::Err::Err(&local_130,local_110);
      Result<wasm::Type>::Result(__return_storage_ptr__,&local_130);
      wasm::Err::~Err(&local_130);
    }
    Result<wasm::Type>::~Result((Result<wasm::Type> *)&err_1);
    pPVar2 = ctx_local;
    uVar1 = limits.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
    if (bVar3) {
      Result<wasm::Ok>::operator*((Result<wasm::Ok> *)local_48);
      pTVar4 = Result<wasm::Type>::operator*
                         ((Result<wasm::Type> *)
                          ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      local_138 = ParseModuleTypesCtx::makeTableType((ParseModuleTypesCtx *)uVar1,pPVar2,pTVar4->id)
      ;
      Result<wasm::Type>::Result<wasm::Type>(__return_storage_ptr__,&local_138);
    }
    Result<wasm::Type>::~Result
              ((Result<wasm::Type> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
  }
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TableTypeT> tabletypeContinued(Ctx& ctx,
                                                    Type addressType) {
  auto limits = addressType == Type::i32 ? limits32(ctx) : limits64(ctx);
  CHECK_ERR(limits);
  auto type = reftype(ctx);
  CHECK_ERR(type);
  return ctx.makeTableType(addressType, *limits, *type);
}